

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O3

Move __thiscall Board::checkMove(Board *this,size_t row,size_t col)

{
  pointer puVar1;
  Move MVar2;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  
  if (row == 0) {
    sVar5 = this->sizeInt;
  }
  else {
    sVar5 = this->sizeInt;
    puVar1 = (this->values).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar3 = sVar5 * (row - 1) + col;
    uVar4 = (long)(this->values).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3;
    if (uVar4 <= uVar3) goto LAB_00113879;
    if (puVar1[uVar3] == this->nullValue) {
      makeMove(this,row,col,row - 1,col);
      return UP;
    }
  }
  if (col < sVar5 - 1) {
    uVar3 = sVar5 * row + col + 1;
    puVar1 = (this->values).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar4 = (long)(this->values).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3;
    if (uVar4 <= uVar3) goto LAB_00113879;
    if (puVar1[uVar3] == this->nullValue) {
      makeMove(this,row,col,row,col + 1);
      return RIGHT;
    }
  }
  if (row < sVar5 - 1) {
    uVar3 = sVar5 * (row + 1) + col;
    puVar1 = (this->values).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar4 = (long)(this->values).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3;
    if (uVar4 <= uVar3) goto LAB_00113879;
    if (puVar1[uVar3] == this->nullValue) {
      makeMove(this,row,col,row + 1,col);
      return DOWN;
    }
  }
  MVar2 = NOT_ALLOWED;
  if (col != 0) {
    uVar3 = (col + sVar5 * row) - 1;
    puVar1 = (this->values).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar4 = (long)(this->values).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3;
    if (uVar4 <= uVar3) {
LAB_00113879:
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar3,
                 uVar4);
    }
    if (puVar1[uVar3] == this->nullValue) {
      makeMove(this,row,col,row,col - 1);
      MVar2 = LEFT;
    }
  }
  return MVar2;
}

Assistant:

Move Board::checkMove( size_t row, size_t col )
{        
    if ( row > 0 && ( values.at(( row - 1 ) * sizeInt + col ) == nullValue ))
    {
        makeMove( row, col, row - 1, col );
        return Move::UP;
    }
    if ( col < ( sizeInt - 1 ) && ( values.at( row * sizeInt + col + 1 ) == nullValue ))
    {
        makeMove( row, col, row, col + 1 );
        return Move::RIGHT;
    }
    if ( row < ( sizeInt - 1 ) && ( values.at(( row + 1 ) * sizeInt + col )  == nullValue ))
    {
        makeMove( row, col, row + 1, col );
        return Move::DOWN;
    }
    if ( col > 0 && ( values.at( row * sizeInt + col - 1 ) == nullValue ))
    {
        makeMove( row, col, row, col -1 );
        return Move::LEFT;
    }

    return Move::NOT_ALLOWED;
}